

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O1

int main(void)

{
  ostringstream *poVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  char *pcVar4;
  undefined1 local_1a0 [392];
  
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = (ostringstream *)(local_1a0 + 0x10);
    local_1a0._0_8_ = Logger.ChannelName;
    local_1a0._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Basic API test running for 2 seconds",0x24);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  bVar2 = TestAPI();
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = (ostringstream *)(local_1a0 + 0x10);
    local_1a0._0_8_ = Logger.ChannelName;
    local_1a0._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Test returned result = ",0x17);
    pcVar4 = "false";
    if (bVar2) {
      pcVar4 = "true";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,(ulong)bVar2 ^ 5);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  return bVar2 - 1;
}

Assistant:

int main()
{
    Logger.Info("Basic API test running for 2 seconds");

    const bool result = TestAPI();

    Logger.Info("Test returned result = ", result);

    return result ? 0 : -1;
}